

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O0

void Gia_ManHashProfile(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int local_28;
  uint local_1c;
  int Limit;
  int Counter;
  int i;
  int iEntry;
  Gia_Man_t *p_local;
  
  uVar1 = Vec_IntSize(&p->vHTable);
  uVar2 = Gia_ManAndNum(p);
  printf("Table size = %d. Entries = %d. ",(ulong)uVar1,(ulong)uVar2);
  printf("Hits = %d. Misses = %d.\n",p->nHashHit & 0xffffffff,p->nHashMiss & 0xffffffff);
  iVar3 = Vec_IntSize(&p->vHTable);
  iVar3 = Abc_MinInt(1000,iVar3);
  for (Limit = 0; Limit < iVar3; Limit = Limit + 1) {
    local_1c = 0;
    Counter = Vec_IntEntry(&p->vHTable,Limit);
    while (Counter != 0) {
      local_1c = local_1c + 1;
      if (Counter == 0) {
        local_28 = 0;
      }
      else {
        local_28 = Vec_IntEntry(&p->vHash,Counter);
      }
      Counter = local_28;
    }
    if (local_1c != 0) {
      printf("%d ",(ulong)local_1c);
    }
  }
  printf("\n");
  return;
}

Assistant:

void Gia_ManHashProfile( Gia_Man_t * p )
{
    int iEntry;
    int i, Counter, Limit;
    printf( "Table size = %d. Entries = %d. ", Vec_IntSize(&p->vHTable), Gia_ManAndNum(p) );
    printf( "Hits = %d. Misses = %d.\n", (int)p->nHashHit, (int)p->nHashMiss );
    Limit = Abc_MinInt( 1000, Vec_IntSize(&p->vHTable) );
    for ( i = 0; i < Limit; i++ )
    {
        Counter = 0;
        for ( iEntry = Vec_IntEntry(&p->vHTable, i); 
              iEntry; 
              iEntry = iEntry? Vec_IntEntry(&p->vHash, iEntry) : 0 )
            Counter++;
        if ( Counter ) 
            printf( "%d ", Counter );
    }
    printf( "\n" );
}